

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onBeforeRet(RACFGBuilder *this,FuncRetNode *funcRet)

{
  bool bVar1;
  Error EVar2;
  undefined8 *in_RSI;
  BaseRAPass *in_RDI;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  TypeId typeId;
  Mem mem;
  Reg src;
  Error _err;
  RAWorkReg *workReg;
  uint32_t vIndex;
  Reg *reg;
  FuncValue *ret;
  Operand *op;
  uint32_t i;
  uint32_t opCount;
  Operand *opArray;
  FuncDetail *funcDetail;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  Error in_stack_fffffffffffffcb0;
  uint32_t in_stack_fffffffffffffcb4;
  uint32_t in_stack_fffffffffffffcb8 [2];
  BaseRAPass *in_stack_fffffffffffffcc0;
  undefined4 local_32c;
  undefined1 *in_stack_fffffffffffffce0;
  uint32_t size;
  undefined7 in_stack_fffffffffffffce8;
  char local_2e9;
  undefined1 local_2e8 [20];
  undefined4 local_2d4;
  uint local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  Error local_2c4;
  long local_2c0;
  uint local_2b4;
  FuncNode *local_2b0;
  FuncValue *local_2a8;
  FuncNode *local_2a0;
  uint local_298;
  uint local_294;
  undefined8 *local_290;
  code *local_288;
  FuncNode *local_258;
  FuncNode *local_250;
  FuncNode *local_248;
  int local_23c;
  FuncNode *local_238;
  long local_208;
  long local_200;
  undefined4 local_1f4;
  BaseNode *local_1f0;
  BaseBuilder *local_1e8;
  FuncValue *local_1d8;
  ulong local_1d0;
  code *local_1c8;
  long local_1c0;
  uint local_1b4;
  undefined1 *local_1b0;
  undefined4 *local_1a8;
  undefined1 *local_1a0;
  byte local_191;
  long local_190;
  FuncValue *local_188;
  FuncValue *local_180;
  undefined4 local_174;
  BaseRAPass *local_170;
  undefined4 local_164;
  undefined1 *local_160;
  undefined4 local_158;
  undefined4 local_154 [3];
  uint local_148;
  uint local_144;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *local_138;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *local_130;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *local_128;
  long local_120;
  uint32_t local_118 [2];
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *local_110;
  uint32_t local_108 [2];
  uint32_t local_fc;
  uint32_t local_f8 [2];
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *local_f0;
  undefined1 *local_e8;
  undefined4 local_dc;
  BaseBuilder *local_d8;
  uint local_cc;
  undefined1 *local_c8;
  undefined4 *local_c0;
  FuncNode *local_b8;
  FuncNode *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 local_94;
  undefined4 local_90;
  uint local_8c;
  undefined1 *local_88;
  undefined4 *local_80;
  undefined4 local_74;
  undefined1 *local_70;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 *local_50;
  undefined1 *local_48;
  undefined4 local_3c;
  undefined1 *local_38;
  undefined4 local_2c;
  BaseRAPass *local_28;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *local_20;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *local_18;
  undefined1 *local_10;
  uint32_t local_8 [2];
  
  local_128 = (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)
              (in_RDI->super_FuncPass).super_Pass._vptr_Pass;
  local_118 = *(uint32_t (*) [2])(local_128 + 0x98);
  local_288 = (code *)((long)local_118 + 0x34);
  local_290 = in_RSI + 8;
  local_294 = (uint)*(byte *)((long)in_RSI + 0x12);
  local_1e8 = (in_RDI->super_FuncPass).super_Pass._cb;
  local_1f0 = (BaseNode *)*in_RSI;
  local_1e8->_cursor = local_1f0;
  local_298 = 0;
  do {
    if (local_294 <= local_298) {
      return 0;
    }
    local_2a0 = (FuncNode *)(local_290 + (ulong)local_298 * 2);
    local_1d0 = (ulong)local_298;
    local_1c8 = local_288;
    local_2a8 = FuncValuePack::operator[]
                          ((FuncValuePack *)
                           CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                           CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    local_258 = local_2a0;
    local_250 = local_2a0;
    local_b8 = local_2a0;
    local_b0 = local_2a0;
    if ((((undefined1  [848])*local_2a0 & (undefined1  [848])0x7) == (undefined1  [848])0x1) &&
       (local_1d8 = local_2a8, (char)(local_2a8->_data >> 0x18) == '\x16')) {
      local_248 = local_2a0;
      local_2b0 = local_2a0;
      local_238 = local_2a0;
      local_23c = *(int *)&local_2a0->field_0x4;
      local_2b4 = local_23c - 0x100;
      if (local_2b4 < 0xfffffeff) {
        local_2c4 = BaseRAPass::virtIndexAsWorkReg
                              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8[1],
                               (RAWorkReg **)
                               CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        if (local_2c4 != 0) {
          return local_2c4;
        }
        local_208 = local_2c0;
        local_a8 = (undefined4 *)(local_2c0 + 0x20);
        local_a0 = local_a8;
        if (((byte)((uint)*local_a8 >> 8) & 0xf) != 1) {
          EVar2 = DebugUtils::errored(0x19);
          return EVar2;
        }
        local_200 = local_2c0;
        local_2e8._16_4_ = *(undefined4 *)(local_2c0 + 0x20);
        local_1c0 = local_2c0;
        local_1b4 = *(uint *)(local_2c0 + 4);
        local_1a8 = &local_2d4;
        local_1b0 = local_2e8 + 0x10;
        local_90 = 0;
        local_94 = 0;
        local_2cc = 0;
        local_2c8 = 0;
        local_1a0 = local_2e8;
        local_64 = 2;
        local_60 = 2;
        local_74 = 2;
        local_50 = &local_74;
        local_54 = 0;
        local_58 = 0;
        local_5c = 0;
        local_2e8._0_4_ = 2;
        local_2e8._4_4_ = 0;
        local_2e8._8_4_ = 0;
        local_2e8._12_4_ = 0;
        local_190 = local_2c0;
        local_120 = *(long *)(local_2c0 + 8);
        local_191 = *(byte *)(local_120 + 0xd);
        local_2e9 = TypeUtils::_typeData[local_191];
        local_188 = local_2a8;
        local_1f4 = local_2e8._16_4_;
        local_cc = local_1b4;
        local_c8 = local_1b0;
        local_c0 = local_1a8;
        local_8c = local_1b4;
        local_88 = local_1b0;
        local_80 = local_1a8;
        local_70 = local_1a0;
        local_48 = local_1a0;
        local_2d4 = local_2e8._16_4_;
        local_2d0 = local_1b4;
        bVar1 = Support::test<unsigned_int,asmjit::v1_14::FuncValue::Bits>
                          (local_2a8->_data,kTypeIdMask);
        if (bVar1) {
          local_180 = local_2a8;
          local_2e9 = (char)local_2a8->_data;
        }
        size = (uint32_t)((ulong)in_stack_fffffffffffffce0 >> 0x20);
        if (local_2e9 == '*') {
          EVar2 = BaseRAPass::useTemporaryMem
                            (in_RDI,(BaseMem *)CONCAT17(0x2a,in_stack_fffffffffffffce8),size,
                             (uint32_t)in_stack_fffffffffffffce0);
          if (EVar2 != 0) {
            return EVar2;
          }
          in_stack_fffffffffffffce0 = local_2e8;
          local_164 = 4;
          local_3c = 4;
          local_2e8._0_4_ = local_2e8._0_4_ & 0xffffff | 0x4000000;
          local_d8 = (in_RDI->super_FuncPass).super_Pass._cb;
          local_144 = 0x1d9;
          local_148 = 0x4c5;
          if ((in_RDI->field_0x292 & 1) == 0) {
            local_32c = 0x1d9;
          }
          else {
            local_32c = 0x4c5;
          }
          local_130 = (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)
                      &local_2d4;
          local_dc = local_32c;
          local_e8 = local_2e8;
          local_160 = in_stack_fffffffffffffce0;
          local_f0 = local_130;
          local_38 = in_stack_fffffffffffffce0;
          local_20 = local_130;
          local_10 = local_e8;
          EVar2 = BaseEmitter::_emitI((BaseEmitter *)in_stack_fffffffffffffcc0,
                                      in_stack_fffffffffffffcb8[1],
                                      (Operand_ *)
                                      CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                                      (Operand_ *)
                                      CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8))
          ;
          if (EVar2 != 0) {
            return EVar2;
          }
          EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::fld
                            ((EmitterExplicitT<asmjit::v1_14::x86::Compiler> *)
                             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                             (Mem *)0x1f5c03);
          if (EVar2 != 0) {
            return EVar2;
          }
        }
        else {
          if (local_2e9 != '+') {
            EVar2 = DebugUtils::errored(0x19);
            return EVar2;
          }
          EVar2 = BaseRAPass::useTemporaryMem
                            (in_RDI,(BaseMem *)CONCAT17(0x2b,in_stack_fffffffffffffce8),size,
                             (uint32_t)in_stack_fffffffffffffce0);
          if (EVar2 != 0) {
            return EVar2;
          }
          in_stack_fffffffffffffcc0 = (BaseRAPass *)local_2e8;
          local_174 = 8;
          local_2c = 8;
          local_2e8._0_4_ = local_2e8._0_4_ & 0xffffff | 0x8000000;
          in_stack_fffffffffffffcb8 = (uint32_t  [2])(in_RDI->super_FuncPass).super_Pass._cb;
          local_154[0]._0_1_ = 0xd6;
          local_154[0]._1_1_ = 1;
          local_154[0]._2_1_ = kSimple;
          local_154[0]._3_1_ = kNone;
          local_158._0_1_ = 0xc1;
          local_158._1_1_ = 4;
          local_158._2_1_ = kSimple;
          local_158._3_1_ = kNone;
          if ((in_RDI->field_0x292 & 1) == 0) {
            in_stack_fffffffffffffcb4 = 0x1d6;
          }
          else {
            in_stack_fffffffffffffcb4 = 0x4c1;
          }
          local_138 = (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)
                      &local_2d4;
          local_108 = (uint32_t  [2])local_2e8;
          local_170 = in_stack_fffffffffffffcc0;
          local_110 = local_138;
          local_fc = in_stack_fffffffffffffcb4;
          local_f8 = in_stack_fffffffffffffcb8;
          local_28 = in_stack_fffffffffffffcc0;
          local_18 = local_138;
          local_8 = local_108;
          in_stack_fffffffffffffcb0 =
               BaseEmitter::_emitI((BaseEmitter *)in_stack_fffffffffffffcc0,
                                   in_stack_fffffffffffffcb8[1],
                                   (Operand_ *)
                                   CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                                   (Operand_ *)
                                   CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
          if (in_stack_fffffffffffffcb0 != 0) {
            return in_stack_fffffffffffffcb0;
          }
          EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::fld
                            ((EmitterExplicitT<asmjit::v1_14::x86::Compiler> *)
                             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                             (Mem *)0x1f5e5c);
          if (EVar2 != 0) {
            return EVar2;
          }
          in_stack_fffffffffffffcac = 0;
        }
      }
    }
    local_298 = local_298 + 1;
  } while( true );
}

Assistant:

Error RACFGBuilder::onBeforeRet(FuncRetNode* funcRet) noexcept {
  const FuncDetail& funcDetail = _pass->func()->detail();
  const Operand* opArray = funcRet->operands();
  uint32_t opCount = funcRet->opCount();

  cc()->_setCursor(funcRet->prev());

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand& op = opArray[i];
    const FuncValue& ret = funcDetail.ret(i);

    if (!op.isReg())
      continue;

    if (ret.regType() == RegType::kX86_St) {
      const Reg& reg = op.as<Reg>();
      uint32_t vIndex = Operand::virtIdToIndex(reg.id());

      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        if (workReg->group() != RegGroup::kVec)
          return DebugUtils::errored(kErrorInvalidAssignment);

        Reg src(workReg->signature(), workReg->virtId());
        Mem mem;

        TypeId typeId = TypeUtils::scalarOf(workReg->typeId());
        if (ret.hasTypeId())
          typeId = ret.typeId();

        switch (typeId) {
          case TypeId::kFloat32:
            ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
            mem.setSize(4);
            ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), mem, src.as<Xmm>()));
            ASMJIT_PROPAGATE(cc()->fld(mem));
            break;

          case TypeId::kFloat64:
            ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
            mem.setSize(8);
            ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), mem, src.as<Xmm>()));
            ASMJIT_PROPAGATE(cc()->fld(mem));
            break;

          default:
            return DebugUtils::errored(kErrorInvalidAssignment);
        }
      }
    }
  }

  return kErrorOk;
}